

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

ostream * jsonnet::internal::operator<<(ostream *o,Kind v)

{
  char *pcVar1;
  ostream *in_RDI;
  
  pcVar1 = Token::toString((Kind)((ulong)in_RDI >> 0x20));
  std::operator<<(in_RDI,pcVar1);
  return in_RDI;
}

Assistant:

static inline std::ostream &operator<<(std::ostream &o, Token::Kind v)
{
    o << Token::toString(v);
    return o;
}